

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

uint toi(void *p,int n)

{
  byte bVar1;
  uint uVar2;
  uchar *v;
  int n_local;
  void *p_local;
  
  if (n < 2) {
    if (n == 1) {
      p_local._4_4_ = (uint)*p;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    bVar1 = *p;
    uVar2 = toi((void *)((long)p + 1),n + -1);
    p_local._4_4_ = (uint)bVar1 + uVar2 * 0x100;
  }
  return p_local._4_4_;
}

Assistant:

static unsigned int
toi(const void *p, int n)
{
	const unsigned char *v = (const unsigned char *)p;
	if (n > 1)
		return v[0] + 256 * toi(v + 1, n - 1);
	if (n == 1)
		return v[0];
	return (0);
}